

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

mg_connection * mg_create_connection(mg_mgr *mgr,mg_event_handler_t callback,mg_add_sock_opts opts)

{
  int iVar1;
  double dVar2;
  mg_connection *local_20;
  mg_connection *conn;
  mg_event_handler_t callback_local;
  mg_mgr *mgr_local;
  
  local_20 = (mg_connection *)calloc(1,0xd0);
  if (local_20 == (mg_connection *)0x0) {
    if (opts.error_string != (char **)0x0) {
      *opts.error_string = "failed create connection";
    }
  }
  else {
    local_20->sock = -1;
    local_20->handler = callback;
    local_20->mgr = mgr;
    dVar2 = mg_time();
    local_20->last_io_time = (long)dVar2;
    local_20->flags = (ulong)(opts.flags & 0x3f01000);
    local_20->user_data = opts.user_data;
    local_20->recv_mbuf_limit = 0xffffffffffffffff;
    iVar1 = mg_if_create_conn(local_20);
    if (iVar1 == 0) {
      free(local_20);
      local_20 = (mg_connection *)0x0;
      if (opts.error_string != (char **)0x0) {
        *opts.error_string = "failed init connection";
      }
    }
  }
  return local_20;
}

Assistant:

mg_connection *mg_create_connection(
        struct mg_mgr *mgr, mg_event_handler_t callback,
        struct mg_add_sock_opts opts) {
    struct mg_connection *conn;

    if ((conn = (struct mg_connection *) MG_CALLOC(1, sizeof(*conn))) != NULL) {
        conn->sock = INVALID_SOCKET;
        conn->handler = callback;
        conn->mgr = mgr;
        conn->last_io_time = mg_time();
        conn->flags = opts.flags & _MG_ALLOWED_CONNECT_FLAGS_MASK;
        conn->user_data = opts.user_data;
        /*
     * SIZE_MAX is defined as a long long constant in
     * system headers on some platforms and so it
     * doesn't compile with pedantic ansi flags.
     */
        conn->recv_mbuf_limit = ~0;
        if (!mg_if_create_conn(conn)) {
            MG_FREE(conn);
            conn = NULL;
            MG_SET_PTRPTR(opts.error_string, "failed init connection");
        }
    } else {
        MG_SET_PTRPTR(opts.error_string, "failed create connection");
    }

    return conn;
}